

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall icu_63::MessagePattern::hashCode(MessagePattern *this)

{
  UMessagePatternApostropheMode UVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int32_t i;
  long lVar6;
  
  UVar1 = this->aposMode;
  iVar2 = UnicodeString::doHashCode(&this->msg);
  iVar4 = this->partsLength;
  iVar3 = (iVar2 + UVar1 * 0x25) * 0x25 + iVar4;
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
    iVar2 = Part::hashCode((Part *)((long)&this->parts->type + lVar5));
    iVar3 = iVar2 + iVar3 * 0x25;
    iVar4 = this->partsLength;
    lVar5 = lVar5 + 0x10;
  }
  return iVar3;
}

Assistant:

int32_t
MessagePattern::hashCode() const {
    int32_t hash=(aposMode*37+msg.hashCode())*37+partsLength;
    for(int32_t i=0; i<partsLength; ++i) {
        hash=hash*37+parts[i].hashCode();
    }
    return hash;
}